

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InsecureRandomDataProvider.cc
# Opt level: O2

long __thiscall InsecureRandomDataProvider::random(InsecureRandomDataProvider *this)

{
  time_t tVar1;
  long lVar2;
  
  if (this->seeded_random == false) {
    tVar1 = QUtil::get_current_time();
    srandom((uint)tVar1 ^ 0xcccc);
    this->seeded_random = true;
    lVar2 = ::random();
    return lVar2;
  }
  lVar2 = ::random();
  return lVar2;
}

Assistant:

long
InsecureRandomDataProvider::random()
{
    if (!this->seeded_random) {
        // Seed the random number generator with something simple, but just to be interesting, don't
        // use the unmodified current time.  It would be better if this were a more secure seed.
        auto seed = static_cast<unsigned int>(QUtil::get_current_time() ^ 0xcccc);
#ifdef HAVE_RANDOM
        ::srandom(seed);
#else
        srand(seed);
#endif
        this->seeded_random = true;
    }

#ifdef HAVE_RANDOM
    return ::random();
#else
    return rand();
#endif
}